

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hsts.c
# Opt level: O0

CURLcode Curl_hsts_loadfile(Curl_easy *data,hsts *h,char *file)

{
  CURLcode CVar1;
  char *file_local;
  hsts *h_local;
  Curl_easy *data_local;
  
  CVar1 = hsts_load(h,file);
  return CVar1;
}

Assistant:

CURLcode Curl_hsts_loadfile(struct Curl_easy *data,
                            struct hsts *h, const char *file)
{
  DEBUGASSERT(h);
  (void)data;
  return hsts_load(h, file);
}